

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O0

void Js::JavascriptExceptionOperators::Throw(Var object,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  ThreadContext *this;
  JavascriptError *this_00;
  Recycler *pRVar5;
  JavascriptExceptionObject *this_01;
  bool local_69;
  bool resetStack;
  TrackAllocData local_58;
  JavascriptExceptionObject *local_30;
  JavascriptExceptionObject *exceptionObject;
  JavascriptExceptionObject *exceptionObject_1;
  JavascriptError *javascriptError;
  ScriptContext *scriptContext_local;
  Var object_local;
  
  javascriptError = (JavascriptError *)scriptContext;
  scriptContext_local = (ScriptContext *)object;
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x418,"(scriptContext != nullptr)","scriptContext != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this = ScriptContext::GetThreadContext((ScriptContext *)javascriptError);
  bVar2 = ThreadContext::IsInScript(this);
  if (!bVar2) {
    bVar2 = VarIs<Js::JavascriptError>(scriptContext_local);
    if (bVar2) {
      this_00 = VarTo<Js::JavascriptError>(scriptContext_local);
      BVar3 = JavascriptError::IsExternalError(this_00);
      if (BVar3 != 0) goto LAB_00f7c3f2;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x41f,
                       "(scriptContext->GetThreadContext()->IsInScript() || (VarIs<JavascriptError>(object) && (VarTo<JavascriptError>(object))->IsExternalError()))"
                       ,"Javascript exception raised without being in CallRootFunction");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
LAB_00f7c3f2:
  exceptionObject_1 = (JavascriptExceptionObject *)0x0;
  bVar2 = VarIs<Js::JavascriptError>(scriptContext_local);
  if (bVar2) {
    exceptionObject_1 = (JavascriptExceptionObject *)VarTo<Js::JavascriptError>(scriptContext_local)
    ;
    exceptionObject =
         JavascriptError::GetJavascriptExceptionObject((JavascriptError *)exceptionObject_1);
    if (exceptionObject != (JavascriptExceptionObject *)0x0) {
      ThrowExceptionObject(exceptionObject,(ScriptContext *)javascriptError,true,(PVOID)0x0,false);
    }
    exceptionObject = (JavascriptExceptionObject *)0x0;
  }
  pRVar5 = ScriptContext::GetRecycler((ScriptContext *)javascriptError);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&JavascriptExceptionObject::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
             ,0x42f);
  pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_58);
  this_01 = (JavascriptExceptionObject *)new<Memory::Recycler>(0x50,pRVar5,0x43c4b0);
  JavascriptExceptionObject::JavascriptExceptionObject
            (this_01,scriptContext_local,(ScriptContext *)javascriptError,
             (JavascriptExceptionContext *)0x0,false);
  local_69 = false;
  local_30 = this_01;
  if (exceptionObject_1 != (JavascriptExceptionObject *)0x0) {
    local_69 = JavascriptError::IsStackPropertyRedefined((JavascriptError *)exceptionObject_1);
    local_69 = !local_69;
    JavascriptError::SetJavascriptExceptionObject((JavascriptError *)exceptionObject_1,local_30);
  }
  ThrowExceptionObject(local_30,(ScriptContext *)javascriptError,true,(PVOID)0x0,local_69);
}

Assistant:

void JavascriptExceptionOperators::Throw(Var object, ScriptContext * scriptContext)
    {
#if defined(DBG) && defined(_M_IX86)
        DbgCheckEHChain();
#endif

        Assert(scriptContext != nullptr);
        // TODO: FastDOM Trampolines will throw JS Exceptions but are not isScriptActive
        //AssertMsg(scriptContext->GetThreadContext()->IsScriptActive() ||
        //          (VarIs<JavascriptError>(object) && (VarTo<JavascriptError>(object))->IsExternalError()),
        //    "Javascript exception raised when script is not active");
        AssertMsg(scriptContext->GetThreadContext()->IsInScript() ||
            (VarIs<JavascriptError>(object) && (VarTo<JavascriptError>(object))->IsExternalError()),
            "Javascript exception raised without being in CallRootFunction");

        JavascriptError *javascriptError = nullptr;
        if (VarIs<JavascriptError>(object))
        {
            // We keep track of the JavascriptExceptionObject that was created when this error
            // was first thrown so that we can always get the correct metadata.
            javascriptError = VarTo<JavascriptError>(object);
            JavascriptExceptionObject *exceptionObject = javascriptError->GetJavascriptExceptionObject();
            if (exceptionObject)
            {
                JavascriptExceptionOperators::ThrowExceptionObject(exceptionObject, scriptContext, true);
            }
        }

        JavascriptExceptionObject * exceptionObject =
            RecyclerNew(scriptContext->GetRecycler(), JavascriptExceptionObject, object, scriptContext, NULL);

        bool resetStack = false;
        if (javascriptError)
        {
            if (!javascriptError->IsStackPropertyRedefined())
            {
                /*
                    Throwing an error object. Original stack property will be pointing to the stack created at time of Error constructor.
                    Reset the stack property to match IE11 behavior
                */
                resetStack = true;
            }
            javascriptError->SetJavascriptExceptionObject(exceptionObject);
        }

        JavascriptExceptionOperators::ThrowExceptionObject(exceptionObject, scriptContext, /*considerPassingToDebugger=*/ true, /*returnAddress=*/ nullptr, resetStack);
    }